

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TernaryExpression.hpp
# Opt level: O0

size_t __thiscall Kandinsky::TernaryExpression::numberOfInternalNodes(TernaryExpression *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  peVar4 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139e7c);
  iVar1 = (*peVar4->_vptr_BaseExpression[8])();
  peVar4 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139e9c);
  iVar2 = (*peVar4->_vptr_BaseExpression[8])();
  peVar4 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139ec3);
  iVar3 = (*peVar4->_vptr_BaseExpression[8])();
  return CONCAT44(extraout_var,iVar1) + 1 + CONCAT44(extraout_var_00,iVar2) +
         CONCAT44(extraout_var_01,iVar3);
}

Assistant:

virtual size_t numberOfInternalNodes() const
        {
            return 1 + m_arg1->numberOfInternalNodes()
                + m_arg2->numberOfInternalNodes() + m_arg3->numberOfInternalNodes();
        }